

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::
         write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  appender aVar1;
  format_specs<char> *in_stack_00000218;
  decimal_fp<float> *in_stack_00000220;
  locale_ref in_stack_00000228;
  float_specs in_stack_00000230;
  appender in_stack_00000238;
  
  aVar1 = do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                    (in_stack_00000238,in_stack_00000220,in_stack_00000218,in_stack_00000230,
                     in_stack_00000228);
  return (appender)
         aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, const DecimalFP& f,
                                 const format_specs<Char>& specs,
                                 float_specs fspecs, locale_ref loc)
    -> OutputIt {
  if (is_constant_evaluated()) {
    return do_write_float<OutputIt, DecimalFP, Char,
                          fallback_digit_grouping<Char>>(out, f, specs, fspecs,
                                                         loc);
  } else {
    return do_write_float(out, f, specs, fspecs, loc);
  }
}